

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_shape_dice(parser *p)

{
  long lVar1;
  _Bool _Var2;
  void *pvVar3;
  dice_t *dice_00;
  char *string_00;
  char *string;
  dice_t *dice;
  effect *effect;
  player_shape *shape;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    dice = *(dice_t **)((long)pvVar3 + 0x100);
    if (dice == (dice_t *)0x0) {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      for (; lVar1._0_4_ = dice->b, lVar1._4_4_ = dice->x, lVar1 != 0; dice = *(dice_t **)dice) {
      }
      dice_00 = dice_new();
      if (dice_00 == (dice_t *)0x0) {
        p_local._4_4_ = PARSE_ERROR_INVALID_DICE;
      }
      else {
        string_00 = parser_getstr(p,"dice");
        _Var2 = dice_parse_string(dice_00,string_00);
        if (_Var2) {
          dice_free(*(dice_t **)&dice->ex_b);
          *(dice_t **)&dice->ex_b = dice_00;
          p_local._4_4_ = PARSE_ERROR_NONE;
        }
        else {
          dice_free(dice_00);
          p_local._4_4_ = PARSE_ERROR_INVALID_DICE;
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_shape_dice(struct parser *p) {
	struct player_shape *shape = parser_priv(p);
	struct effect *effect;
	dice_t *dice;
	const char *string;

	if (!shape) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* If there is no effect, assume that this is human and not parser error. */
	effect = shape->effect;
	if (effect == NULL) {
		return PARSE_ERROR_NONE;
	}
	while (effect->next) effect = effect->next;

	dice = dice_new();
	if (dice == NULL) {
		return PARSE_ERROR_INVALID_DICE;
	}

	string = parser_getstr(p, "dice");
	if (dice_parse_string(dice, string)) {
		dice_free(effect->dice);
		effect->dice = dice;
	} else {
		dice_free(dice);
		return PARSE_ERROR_INVALID_DICE;
	}

	return PARSE_ERROR_NONE;
}